

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O0

DdNode * Abc_NtkMultiDeriveBdd_rec(DdManager *dd,Abc_Obj_t *pNode,Vec_Ptr_t *vFanins)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  DdNode *n;
  DdNode *n_00;
  DdNode *bFunc1;
  DdNode *bFunc0;
  DdNode *bFunc;
  Vec_Ptr_t *vFanins_local;
  Abc_Obj_t *pNode_local;
  DdManager *dd_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0x107,"DdNode *Abc_NtkMultiDeriveBdd_rec(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)")
    ;
  }
  if ((*(uint *)&pNode->field_0x14 >> 6 & 1) == 0) {
    *(uint *)&pNode->field_0x14 = *(uint *)&pNode->field_0x14 & 0xffffffbf | 0x40;
    Vec_PtrPush(vFanins,pNode);
    pAVar3 = Abc_ObjFanin(pNode,0);
    n = Abc_NtkMultiDeriveBdd_rec(dd,pAVar3,vFanins);
    Cudd_Ref(n);
    pAVar3 = Abc_ObjFanin(pNode,1);
    n_00 = Abc_NtkMultiDeriveBdd_rec(dd,pAVar3,vFanins);
    Cudd_Ref(n_00);
    iVar1 = Abc_ObjFaninC0(pNode);
    iVar2 = Abc_ObjFaninC1(pNode);
    dd_local = (DdManager *)
               Cudd_bddAnd(dd,(DdNode *)((ulong)n ^ (long)iVar1),
                           (DdNode *)((ulong)n_00 ^ (long)iVar2));
    Cudd_Ref((DdNode *)dd_local);
    Cudd_RecursiveDeref(dd,(DdNode *)((ulong)n ^ (long)iVar1));
    Cudd_RecursiveDeref(dd,(DdNode *)((ulong)n_00 ^ (long)iVar2));
    (pNode->field_5).pData = dd_local;
    if ((pNode->field_5).pData == (void *)0x0) {
      __assert_fail("pNode->pData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0x11c,
                    "DdNode *Abc_NtkMultiDeriveBdd_rec(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
    }
  }
  else {
    if ((pNode->field_5).pData == (void *)0x0) {
      __assert_fail("pNode->pData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0x10b,
                    "DdNode *Abc_NtkMultiDeriveBdd_rec(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
    }
    dd_local = (DdManager *)(pNode->field_5).pData;
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * Abc_NtkMultiDeriveBdd_rec( DdManager * dd, Abc_Obj_t * pNode, Vec_Ptr_t * vFanins )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    assert( !Abc_ObjIsComplement(pNode) );
    // if the result is available return
    if ( pNode->fMarkC )
    {
        assert( pNode->pData ); // network has a cycle
        return (DdNode *)pNode->pData;
    }
    // mark the node as visited
    pNode->fMarkC = 1;
    Vec_PtrPush( vFanins, pNode );
    // compute the result for both branches
    bFunc0 = Abc_NtkMultiDeriveBdd_rec( dd, Abc_ObjFanin(pNode,0), vFanins ); Cudd_Ref( bFunc0 );
    bFunc1 = Abc_NtkMultiDeriveBdd_rec( dd, Abc_ObjFanin(pNode,1), vFanins ); Cudd_Ref( bFunc1 );
    bFunc0 = Cudd_NotCond( bFunc0, (long)Abc_ObjFaninC0(pNode) );
    bFunc1 = Cudd_NotCond( bFunc1, (long)Abc_ObjFaninC1(pNode) );
    // get the final result
    bFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( dd, bFunc0 );
    Cudd_RecursiveDeref( dd, bFunc1 );
    // set the result
    pNode->pData = bFunc;
    assert( pNode->pData );
    return bFunc;
}